

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestPrettyPrintCoverage::TestPrettyPrintCoverage(TestPrettyPrintCoverage *this)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  TestPrettyPrintCoverage *local_10;
  TestPrettyPrintCoverage *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"PrettyPrintCoverage",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Test",&local_69);
  testinator::Test::Test(&this->super_Test,(string *)local_30,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestPrettyPrintCoverage_002c2500;
  return;
}

Assistant:

DEF_TEST(PrettyPrintCoverage, Test)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestPrettyPrintCoverageInternal myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected1 = "[1,2,3]";
  static string expected2 = "\"Hello\"";
  return oss.str().find(expected1) != string::npos
    && oss.str().find(expected2) != string::npos;
}